

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O2

void __thiscall Infector::Container::bindSingleAs<concreteABC,IA,IB,IC>(Container *this)

{
  long lVar1;
  bool bVar2;
  iterator iVar3;
  AnyShared<concreteABC,_IA,_IB,_IC> *this_00;
  mapped_type *ppIVar4;
  key_type local_28;
  
  bVar2 = resolve_multiple_inheritance<concreteABC,IA,IB,IC>(this);
  if (!bVar2) {
    launch_exception<Infector::ExExistingInterface>(this);
  }
  local_28._M_target = (type_info *)&concreteABC::typeinfo;
  iVar3 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_28);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    this_00 = (AnyShared<concreteABC,_IA,_IB,_IC> *)operator_new(0x58);
    *(undefined8 *)&(this_00->multi_solver)._M_h._M_rehash_policy = 0;
    (this_00->multi_solver)._M_h._M_rehash_policy._M_next_resize = 0;
    (this_00->multi_solver)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (this_00->multi_solver)._M_h._M_element_count = 0;
    (this_00->multi_solver)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this_00->multi_solver)._M_h._M_bucket_count = 0;
    (this_00->ist).super___shared_ptr<concreteABC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_00->ist).super___shared_ptr<concreteABC,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)this_00 = 0;
    *(undefined8 *)&this_00->a = 0;
    (this_00->multi_solver)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    AnyShared<concreteABC,_IA,_IB,_IC>::AnyShared(this_00);
    lVar1 = *(long *)(*(long *)this_00 + -0x38);
    local_28._M_target = (type_info *)&concreteABC::typeinfo;
    ppIVar4 = std::__detail::
              _Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,&local_28);
    *ppIVar4 = (mapped_type)(&this_00->field_0x0 + lVar1);
  }
  return;
}

Assistant:

void Container::bindSingleAs(){
        bool tests = type_tests<T,Contracts...>(); // Compile time tests.
        (void) tests;  //fix unused variable warning

        bool success = false;
        try{
            success = resolve_multiple_inheritance<T,Contracts...>();
        }catch(std::exception & ex){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            throw ex;
        }catch(...){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            launch_exception<ExUnkownException>();
        }


        if(!success) //no changes.
            launch_exception<ExExistingInterface>();

        try{
            if(singleIstances.find( std::type_index(typeid(T)) )
                                    ==singleIstances.end())
                singleIstances[std::type_index(typeid(T))]
                               = new AnyShared<T,Contracts...>();
        }catch(std::exception & ex){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            throw ex;
        }catch(...){
            rollback_multiple_inheritance<T,Contracts...>(); //revert changes
            launch_exception<ExUnkownException>();
        }
    }